

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteGml.c
# Opt level: O0

void Io_WriteGml(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  FILE *pFile;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if ((iVar2 == 0) && (iVar2 = Abc_NtkIsLogic(pNtk), iVar2 == 0)) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteGml.c"
                  ,0x34,"void Io_WriteGml(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteGml(): Cannot open the output file \"%s\".\n",pFileName);
  }
  else {
    pcVar5 = pNtk->pName;
    pcVar3 = Extra_TimeStamp();
    fprintf(__stream,"# GML for \"%s\" written by ABC on %s\n",pcVar5,pcVar3);
    fprintf(__stream,"graph [\n");
    fprintf(__stream,"\n");
    for (local_34 = 0; iVar2 = Abc_NtkPoNum(pNtk), local_34 < iVar2; local_34 = local_34 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,local_34);
      uVar1 = pAVar4->Id;
      pcVar5 = Abc_ObjName(pAVar4);
      fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar5);
      fprintf(__stream,"        graphics [ type \"triangle\" fill \"#00FFFF\" ]\n");
      fprintf(__stream,"    ]\n");
    }
    fprintf(__stream,"\n");
    for (local_34 = 0; iVar2 = Abc_NtkPiNum(pNtk), local_34 < iVar2; local_34 = local_34 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,local_34);
      uVar1 = pAVar4->Id;
      pcVar5 = Abc_ObjName(pAVar4);
      fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar5);
      fprintf(__stream,"        graphics [ type \"triangle\" fill \"#00FF00\" ]\n");
      fprintf(__stream,"    ]\n");
    }
    fprintf(__stream,"\n");
    for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar2; local_34 = local_34 + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,local_34);
      iVar2 = Abc_ObjIsLatch(pAVar4);
      if (iVar2 != 0) {
        uVar1 = pAVar4->Id;
        pcVar5 = Abc_ObjName(pAVar4);
        fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar5);
        fprintf(__stream,"        graphics [ type \"rectangle\" fill \"#FF0000\" ]\n");
        fprintf(__stream,"    ]\n");
      }
    }
    fprintf(__stream,"\n");
    for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar2; local_34 = local_34 + 1)
    {
      pAVar4 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar4), iVar2 != 0)) {
        uVar1 = pAVar4->Id;
        pcVar5 = Abc_ObjName(pAVar4);
        fprintf(__stream,"    node [ id %5d label \"%s\"\n",(ulong)uVar1,pcVar5);
        fprintf(__stream,"        graphics [ type \"ellipse\" fill \"#CCCCFF\" ]\n");
        fprintf(__stream,"    ]\n");
      }
    }
    fprintf(__stream,"\n");
    for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar2; local_34 = local_34 + 1)
    {
      pAVar4 = Abc_NtkObj(pNtk,local_34);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        for (local_38 = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_38 < iVar2;
            local_38 = local_38 + 1) {
          pAVar6 = Abc_ObjFanin(pAVar4,local_38);
          fprintf(__stream,"    edge [ source %5d   target %5d\n",(ulong)(uint)pAVar4->Id,
                  (ulong)(uint)pAVar6->Id);
          fprintf(__stream,"        graphics [ type \"line\" arrow \"first\" ]\n");
          fprintf(__stream,"    ]\n");
        }
      }
    }
    fprintf(__stream,"]\n");
    fprintf(__stream,"\n");
    fclose(__stream);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the graph structure of AIG in GML.]

  Description [Useful for graph visualization using tools such as yEd: 
  http://www.yworks.com/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Io_WriteGml( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)  );

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteGml(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# GML for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    fprintf( pFile, "graph [\n" );

    // output the POs
    fprintf( pFile, "\n" );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"triangle\" fill \"#00FFFF\" ]\n" );   // blue
        fprintf( pFile, "    ]\n" );
    }
    // output the PIs
    fprintf( pFile, "\n" );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"triangle\" fill \"#00FF00\" ]\n" );   // green
        fprintf( pFile, "    ]\n" );
    }
    // output the latches
    fprintf( pFile, "\n" );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"rectangle\" fill \"#FF0000\" ]\n" );   // red
        fprintf( pFile, "    ]\n" );
    }
    // output the nodes
    fprintf( pFile, "\n" );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        fprintf( pFile, "    node [ id %5d label \"%s\"\n", pObj->Id, Abc_ObjName(pObj) );
        fprintf( pFile, "        graphics [ type \"ellipse\" fill \"#CCCCFF\" ]\n" );     // grey
        fprintf( pFile, "    ]\n" );
    }

    // output the edges
    fprintf( pFile, "\n" );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            fprintf( pFile, "    edge [ source %5d   target %5d\n", pObj->Id, pFanin->Id );
            fprintf( pFile, "        graphics [ type \"line\" arrow \"first\" ]\n" );
            fprintf( pFile, "    ]\n" );
        }
    }

    fprintf( pFile, "]\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );
}